

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckDeprecated(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  uint local_1c;
  int msgcode;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  BVar1 = Level2_Enabled(doc);
  if (BVar1 != no) {
    local_1c = 0;
    if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_APPLET))
    {
      if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
         (node->tag->id != TidyTag_BASEFONT)) {
        if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
           (node->tag->id != TidyTag_CENTER)) {
          if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
             (node->tag->id != TidyTag_DIR)) {
            if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
               (node->tag->id != TidyTag_FONT)) {
              if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                 (node->tag->id != TidyTag_ISINDEX)) {
                if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                   (node->tag->id != TidyTag_MENU)) {
                  if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                     (node->tag->id != TidyTag_S)) {
                    if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                       (node->tag->id != TidyTag_STRIKE)) {
                      if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
                         (node->tag->id == TidyTag_U)) {
                        local_1c = 0x2fe;
                      }
                    }
                    else {
                      local_1c = 0x2fd;
                    }
                  }
                  else {
                    local_1c = 0x2fc;
                  }
                }
                else {
                  local_1c = 0x2fb;
                }
              }
              else {
                local_1c = 0x2fa;
              }
            }
            else {
              local_1c = 0x2f9;
            }
          }
          else {
            local_1c = 0x2f8;
          }
        }
        else {
          local_1c = 0x2f7;
        }
      }
      else {
        local_1c = 0x2f6;
      }
    }
    else {
      local_1c = 0x2f5;
    }
    if (local_1c != 0) {
      prvTidyReportAccessError(doc,node,local_1c);
    }
  }
  return;
}

Assistant:

static void CheckDeprecated( TidyDocImpl* doc, Node* node )
{
    if (Level2_Enabled( doc ))
    {
        int msgcode = 0;
        if ( nodeIsAPPLET(node) )
            msgcode = REPLACE_DEPRECATED_HTML_APPLET;
        else if ( nodeIsBASEFONT(node) )
            msgcode = REPLACE_DEPRECATED_HTML_BASEFONT;
        else if ( nodeIsCENTER(node) )
            msgcode = REPLACE_DEPRECATED_HTML_CENTER;
        else if ( nodeIsDIR(node) )
            msgcode = REPLACE_DEPRECATED_HTML_DIR;
        else if ( nodeIsFONT(node) )
            msgcode = REPLACE_DEPRECATED_HTML_FONT;
        else if ( nodeIsISINDEX(node) )
            msgcode = REPLACE_DEPRECATED_HTML_ISINDEX;
        else if ( nodeIsMENU(node) )
            msgcode = REPLACE_DEPRECATED_HTML_MENU;
        else if ( nodeIsS(node) )
            msgcode = REPLACE_DEPRECATED_HTML_S;
        else if ( nodeIsSTRIKE(node) )
            msgcode = REPLACE_DEPRECATED_HTML_STRIKE;
        else if ( nodeIsU(node) )
            msgcode = REPLACE_DEPRECATED_HTML_U;

        if ( msgcode )
            TY_(ReportAccessError)( doc, node, msgcode );
    }
}